

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void primary(Vm *vm)

{
  char cVar1;
  TokenType TVar2;
  size_t sVar3;
  undefined8 uVar4;
  long lVar5;
  OP_CODE op_code;
  _Bool _Var6;
  uint32_t uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *__nptr;
  uint8_t second;
  double value;
  undefined1 auVar15 [16];
  Variable VVar16;
  CrispyValue CVar17;
  CrispyValue value_00;
  code *pcStack_60;
  char acStack_58 [8];
  Token local_50;
  
  TVar2 = (vm->compiler).token.type;
  switch(TVar2) {
  case TOKEN_OPEN_PAREN:
    pcStack_60 = (code *)0x104f14;
    advance(vm);
    pcStack_60 = (code *)0x104f1c;
    expr(vm);
    if ((vm->compiler).token.type == TOKEN_CLOSE_PAREN) goto LAB_001051ce;
    pcVar9 = "Expected \')\'";
    goto LAB_001051fb;
  case TOKEN_CLOSE_PAREN:
switchD_00104f0a_caseD_1:
    pcVar9 = "Unexpected Token";
LAB_001051fb:
    pcStack_60 = string;
    error(&vm->compiler,pcVar9);
  case TOKEN_DEC_NUMBER:
    sVar3 = (vm->compiler).token.length;
    if (sVar3 == 1) {
      cVar1 = *(vm->compiler).token.start;
      if (cVar1 == '1') {
        op_code = OP_LDC_1;
      }
      else {
        if (cVar1 != '0') goto LAB_00105138;
        op_code = OP_LDC_0;
      }
      goto LAB_0010509d;
    }
LAB_00105138:
    lVar5 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
    __nptr = acStack_58 + lVar5;
    pcVar9 = (vm->compiler).token.start;
    pcVar13 = acStack_58 + lVar5 + -8;
    builtin_strncpy(acStack_58 + lVar5 + -8,"^Q\x10",4);
    pcVar13[4] = '\0';
    pcVar13[5] = '\0';
    pcVar13[6] = '\0';
    pcVar13[7] = '\0';
    memcpy(__nptr,pcVar9,sVar3);
    __nptr[sVar3] = '\0';
    pcVar14 = acStack_58 + lVar5 + -8;
    builtin_strncpy(acStack_58 + lVar5 + -8,"mQ\x10",4);
    pcVar14[4] = '\0';
    pcVar14[5] = '\0';
    pcVar14[6] = '\0';
    pcVar14[7] = '\0';
    value = strtod(__nptr,(char **)0x0);
    break;
  case TOKEN_HEX_NUMBER:
    sVar3 = (vm->compiler).token.length;
    lVar5 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
    __nptr = acStack_58 + lVar5;
    pcVar9 = (vm->compiler).token.start;
    pcVar10 = acStack_58 + lVar5 + -8;
    pcVar10[0] = -0x6a;
    pcVar10[1] = 'O';
    pcVar10[2] = '\x10';
    pcVar10[3] = '\0';
    pcVar10[4] = '\0';
    pcVar10[5] = '\0';
    pcVar10[6] = '\0';
    pcVar10[7] = '\0';
    memcpy(__nptr,pcVar9,sVar3);
    __nptr[sVar3] = '\0';
    pcVar11 = acStack_58 + lVar5 + -8;
    pcVar11[0] = '\x10';
    pcVar11[1] = '\0';
    pcVar11[2] = '\0';
    pcVar11[3] = '\0';
    pcVar11[4] = '\0';
    pcVar11[5] = '\0';
    pcVar11[6] = '\0';
    pcVar11[7] = '\0';
    uVar4 = *(undefined8 *)(acStack_58 + lVar5 + -8);
    pcVar12 = acStack_58 + lVar5 + -8;
    pcVar12[0] = -0x58;
    pcVar12[1] = 'O';
    pcVar12[2] = '\x10';
    pcVar12[3] = '\0';
    pcVar12[4] = '\0';
    pcVar12[5] = '\0';
    pcVar12[6] = '\0';
    pcVar12[7] = '\0';
    uVar8 = strtoul(__nptr,(char **)0x0,(int)uVar4);
    auVar15._8_4_ = (int)(uVar8 >> 0x20);
    auVar15._0_8_ = uVar8;
    auVar15._12_4_ = 0x45300000;
    value = (auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    break;
  case TOKEN_STRING:
    pcStack_60 = (code *)0x104fd9;
    string(vm,true);
    goto LAB_001051ce;
  default:
    if (TVar2 == TOKEN_IDENTIFIER) {
      pcStack_60 = (code *)0x1050c1;
      VVar16 = resolve_var(vm,(vm->compiler).token.start,(vm->compiler).token.length);
      second = (uint8_t)VVar16.index;
      if (vm->frame_count == VVar16.frame_offset) {
        pcStack_60 = (code *)0x1050e3;
        emit_byte_arg(vm,OP_LOAD,second);
        pcStack_60 = (code *)0x1050eb;
        advance(vm);
        TVar2 = (vm->compiler).token.type;
        if ((TVar2 != TOKEN_MINUS_MINUS) && (TVar2 != TOKEN_PLUS_PLUS)) {
          return;
        }
        pcStack_60 = (code *)0x105103;
        advance(vm);
        if ((VVar16._8_8_ >> 0x20 & 1) != 0) {
          emit_byte_arg(vm,((vm->compiler).previous.type != TOKEN_PLUS_PLUS) + OP_INC_1,second);
          return;
        }
        pcVar9 = "Cannot increment value";
        goto LAB_001051fb;
      }
      pcStack_60 = (code *)0x1051ce;
      emit_short_arg(vm,OP_LOAD_OFFSET,(uint8_t)VVar16.frame_offset,second);
      goto LAB_001051ce;
    }
    if (TVar2 == TOKEN_OPEN_BRACE) {
      pcStack_60 = (code *)0x104fe6;
      advance(vm);
      if (((vm->compiler).next.type != TOKEN_COLON) &&
         ((vm->compiler).token.type != TOKEN_CLOSE_BRACE)) {
        return;
      }
      pcStack_60 = (code *)0x105004;
      emit_no_arg(vm,OP_DICT_NEW);
      TVar2 = (vm->compiler).token.type;
      if ((TVar2 != TOKEN_CLOSE_BRACE) && (TVar2 != TOKEN_EOF)) {
        do {
          pcStack_60 = (code *)0x10502f;
          string(vm,true);
          pcStack_60 = (code *)0x105037;
          advance(vm);
          pcStack_60 = (code *)0x10504c;
          consume(&local_50,vm,TOKEN_COLON,"Expected \':\' between key and value in dictionary");
          pcStack_60 = (code *)0x105054;
          expr(vm);
          pcStack_60 = (code *)0x10505f;
          emit_no_arg(vm,OP_STRUCT_SET);
          pcStack_60 = (code *)0x10506a;
          _Var6 = match(vm,TOKEN_COMMA);
        } while (_Var6);
      }
      pcVar9 = "Expected \'}\' after dictionary literal";
      TVar2 = TOKEN_CLOSE_BRACE;
LAB_0010507b:
      pcStack_60 = (code *)0x105084;
      consume(&local_50,vm,TVar2,pcVar9);
      return;
    }
    if (TVar2 == TOKEN_TRUE) {
      op_code = OP_TRUE;
    }
    else if (TVar2 == TOKEN_FALSE) {
      op_code = OP_FALSE;
    }
    else {
      if (TVar2 != TOKEN_NIL) {
        if (TVar2 == TOKEN_OPEN_BRACKET) {
          pcStack_60 = (code *)0x104ea5;
          emit_no_arg(vm,OP_LIST_NEW);
          pcStack_60 = (code *)0x104ead;
          advance(vm);
          pcStack_60 = (code *)0x104eb8;
          _Var6 = match(vm,TOKEN_CLOSE_BRACKET);
          if (_Var6) {
            return;
          }
          do {
            pcStack_60 = (code *)0x104ed0;
            expr(vm);
            pcStack_60 = (code *)0x104edb;
            emit_no_arg(vm,OP_LIST_APPEND);
            pcStack_60 = (code *)0x104ee6;
            _Var6 = match(vm,TOKEN_COMMA);
          } while (_Var6);
          pcVar9 = "Expected \']\' after list literal";
          TVar2 = TOKEN_CLOSE_BRACKET;
          goto LAB_0010507b;
        }
        goto switchD_00104f0a_caseD_1;
      }
      op_code = OP_NIL;
    }
LAB_0010509d:
    pcStack_60 = (code *)0x1050a6;
    emit_no_arg(vm,op_code);
    goto LAB_001051ce;
  }
  builtin_strncpy(__nptr + -8,"rQ\x10",4);
  __nptr[-4] = '\0';
  __nptr[-3] = '\0';
  __nptr[-2] = '\0';
  __nptr[-1] = '\0';
  CVar17 = create_number(value);
  value_00.field_1 = CVar17.field_1;
  value_00._4_4_ = 0;
  value_00.type = CVar17.type;
  builtin_strncpy(__nptr + -8,"|Q\x10",4);
  __nptr[-4] = '\0';
  __nptr[-3] = '\0';
  __nptr[-2] = '\0';
  __nptr[-1] = '\0';
  uVar7 = add_constant(vm,value_00);
  if ((uVar7 & 0xff00) == 0) {
    __nptr[-8] = '\x12';
    __nptr[-7] = '\0';
    __nptr[-6] = '\0';
    __nptr[-5] = '\0';
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    uVar4 = *(undefined8 *)(__nptr + -8);
    __nptr[-8] = -0x53;
    __nptr[-7] = 'Q';
    __nptr[-6] = '\x10';
    __nptr[-5] = '\0';
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    emit_byte_arg(vm,(OP_CODE)uVar4,(uint8_t)uVar7);
  }
  else {
    __nptr[-8] = '\x13';
    __nptr[-7] = '\0';
    __nptr[-6] = '\0';
    __nptr[-5] = '\0';
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    uVar4 = *(undefined8 *)(__nptr + -8);
    __nptr[-8] = -99;
    __nptr[-7] = 'Q';
    __nptr[-6] = '\x10';
    __nptr[-5] = '\0';
    __nptr[-4] = '\0';
    __nptr[-3] = '\0';
    __nptr[-2] = '\0';
    __nptr[-1] = '\0';
    emit_short_arg(vm,(OP_CODE)uVar4,(uint8_t)(uVar7 >> 8),(uint8_t)uVar7);
  }
LAB_001051ce:
  advance(vm);
  return;
}

Assistant:

static void primary(Vm *vm) {
    Compiler *compiler = &vm->compiler;

    switch (compiler->token.type) {
        case TOKEN_DEC_NUMBER: {
            Token token = compiler->token;
            if (token.length == 1) {
                if (*token.start == '0') {
                    emit_no_arg(vm, OP_LDC_0);
                    break;
                } else if (*compiler->token.start == '1') {
                    emit_no_arg(vm, OP_LDC_1);
                    break;
                }
            }

            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            double res;

            res = strtod(str, NULL);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_HEX_NUMBER: {
            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            uint64_t res;

            res = strtoul(str, NULL, 16);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_OPEN_PAREN: {
            advance(vm);
            expr(vm);
            if (vm->compiler.token.type != TOKEN_CLOSE_PAREN) {
                error(&vm->compiler, "Expected ')'");
            }
            break;
        }
        case TOKEN_IDENTIFIER: {
            Variable var = resolve_var(vm, compiler->token.start, compiler->token.length);
            if (var.frame_offset != vm->frame_count) {
                // TODO bigger numbers
                emit_short_arg(vm, OP_LOAD_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
                break;
            }
            emit_byte_arg(vm, OP_LOAD, (uint8_t) var.index);

            advance(vm);

            if (compiler->token.type == TOKEN_PLUS_PLUS || compiler->token.type == TOKEN_MINUS_MINUS) {
                advance(vm);

                if (!var.assignable) {
                    error(compiler, "Cannot increment value");
                }

                // TODO bigger numbers
                emit_byte_arg(vm, compiler->previous.type == TOKEN_PLUS_PLUS ? OP_INC_1 : OP_DEC_1,
                              (uint8_t) var.index);
            }

            // already advanced
            return;
        }
        case TOKEN_OPEN_BRACKET: {
            emit_no_arg(vm, OP_LIST_NEW);
            advance(vm);

            if (!match(vm, TOKEN_CLOSE_BRACKET)) {
                do {
                    expr(vm);
                    emit_no_arg(vm, OP_LIST_APPEND);
                } while (match(vm, TOKEN_COMMA));

                consume(vm, TOKEN_CLOSE_BRACKET, "Expected ']' after list literal");
            }
            return;
        }
        case TOKEN_OPEN_BRACE: {
            advance(vm);
            // a dictionary, not a block
            if (compiler->next.type == TOKEN_COLON || compiler->token.type == TOKEN_CLOSE_BRACE) {
                emit_no_arg(vm, OP_DICT_NEW);

                if (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
                    do {
                        // consume key
                        string(vm, true);
                        advance(vm);
                        consume(vm, TOKEN_COLON, "Expected ':' between key and value in dictionary");
                        // consume value
                        expr(vm);

                        emit_no_arg(vm, OP_STRUCT_SET);
                    } while (match(vm, TOKEN_COMMA));
                }

                consume(vm, TOKEN_CLOSE_BRACE, "Expected '}' after dictionary literal");
            }

            return;
        }
        case TOKEN_STRING: {
            string(vm, true);
            break;
        }
        case TOKEN_FALSE:
            emit_no_arg(vm, OP_FALSE);
            break;
        case TOKEN_TRUE:
            emit_no_arg(vm, OP_TRUE);
            break;
        case TOKEN_NIL:
            emit_no_arg(vm, OP_NIL);
            break;
        default:
            error(&vm->compiler, "Unexpected Token");
            break;
    }

    advance(vm);
}